

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void DumpEdges(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges,
              vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices)

{
  bool bVar1;
  const_reference pvVar2;
  ostream *poVar3;
  s2textformat local_80 [48];
  undefined1 local_50 [8];
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> v;
  pair<int,_int> *e;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges_local;
  
  __end1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(edges);
  e = (pair<int,_int> *)
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(edges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                *)&e);
    if (!bVar1) break;
    v.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  ::operator*(&__end1);
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_50);
    pvVar2 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                       (vertices,(long)*(int *)(v.
                                                super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->c_);
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_50,pvVar2);
    pvVar2 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                       (vertices,(long)*(int *)((long)(v.
                                                  super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->c_ + 4));
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_50,pvVar2);
    poVar3 = std::operator<<((ostream *)&std::cout,"S2Polyline: ");
    s2textformat::ToString_abi_cxx11_
              (local_80,(vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_50);
    poVar3 = std::operator<<(poVar3,(string *)local_80);
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,*(int *)(v.
                                        super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->c_);
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,*(int *)((long)(v.
                                               super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                              c_ + 4));
    poVar3 = std::operator<<(poVar3,")");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_80);
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_50);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

static void DumpEdges(const vector<S2Builder::Graph::Edge>& edges,
                      const vector<S2Point>& vertices) {
  for (const auto& e : edges) {
    vector<S2Point> v;
    v.push_back(vertices[e.first]);
    v.push_back(vertices[e.second]);
    std::cout << "S2Polyline: " << s2textformat::ToString(v)
              << "(" << e.first << "," << e.second << ")" << std::endl;
  }
}